

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this)

{
  ~IfcSubContractResource
            ((IfcSubContractResource *)
             (&(this->super_IfcConstructionResource).field_0x0 +
             *(long *)(*(long *)&this->super_IfcConstructionResource + -0x18)));
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}